

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parseImport
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  string *this_00;
  Archive *archive;
  undefined8 this_01;
  char *pcVar1;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<tcu::TestNode_**,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
  local_1e0;
  const_iterator local_1d8;
  undefined1 local_1d0 [8];
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> importedCases;
  FilePath local_1b0;
  FilePath local_190;
  string local_170;
  FilePath local_150;
  FilePath local_130;
  string local_110;
  undefined1 local_f0 [8];
  ShaderParser subParser;
  undefined1 local_38 [8];
  string importFileName;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList_local;
  ShaderParser *this_local;
  
  importFileName.field_2._8_8_ = shaderNodeList;
  std::__cxx11::string::string((string *)local_38);
  advanceToken(this,TOKEN_IMPORT);
  assumeToken(this,TOKEN_STRING);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  parseStringLiteral_abi_cxx11_((string *)((long)&subParser.m_curTokenStr.field_2 + 8),this,pcVar1);
  this_00 = (string *)(subParser.m_curTokenStr.field_2._M_local_buf + 8);
  std::__cxx11::string::operator=((string *)local_38,this_00);
  std::__cxx11::string::~string(this_00);
  advanceToken(this,TOKEN_STRING);
  archive = this->m_archive;
  de::FilePath::FilePath(&local_190,&this->m_filename);
  de::FilePath::getDirName_abi_cxx11_(&local_170,&local_190);
  de::FilePath::FilePath(&local_150,&local_170);
  de::FilePath::FilePath(&local_1b0,(string *)local_38);
  de::FilePath::join(&local_130,&local_150,&local_1b0);
  pcVar1 = de::FilePath::getPath(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,pcVar1,
             (allocator<char> *)
             ((long)&importedCases.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  ShaderParser((ShaderParser *)local_f0,archive,&local_110,this->m_caseFactory);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importedCases.
                     super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  de::FilePath::~FilePath(&local_130);
  de::FilePath::~FilePath(&local_1b0);
  de::FilePath::~FilePath(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  de::FilePath::~FilePath(&local_190);
  parse((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_1d0,
        (ShaderParser *)local_f0);
  this_01 = importFileName.field_2._8_8_;
  local_1e0._M_current =
       (TestNode **)
       std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::end
                 ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)
                  importFileName.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<tcu::TestNode*const*,std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>>
  ::__normal_iterator<tcu::TestNode**>
            ((__normal_iterator<tcu::TestNode*const*,std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>>
              *)&local_1d8,&local_1e0);
  __first = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::begin
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_1d0);
  __last = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::end
                     ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_1d0);
  std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
  insert<__gnu_cxx::__normal_iterator<tcu::TestNode*const*,std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>>,void>
            ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)this_01,local_1d8,
             (__normal_iterator<tcu::TestNode_*const_*,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
              )__first._M_current,
             (__normal_iterator<tcu::TestNode_*const_*,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
              )__last._M_current);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_1d0);
  ~ShaderParser((ShaderParser *)local_f0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ShaderParser::parseImport (vector<tcu::TestNode*>& shaderNodeList)
{
	std::string	importFileName;

	advanceToken(TOKEN_IMPORT);

	assumeToken(TOKEN_STRING);
	importFileName = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	{
		ShaderParser					subParser		(m_archive, de::FilePath::join(de::FilePath(m_filename).getDirName(), importFileName).getPath(), m_caseFactory);
		const vector<tcu::TestNode*>	importedCases = subParser.parse();

		// \todo [2015-08-03 pyry] Not exception safe
		shaderNodeList.insert(shaderNodeList.end(), importedCases.begin(), importedCases.end());
	}
}